

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O1

int __thiscall jrtplib::RTPPacketBuilder::AddCSRC(RTPPacketBuilder *this,uint32_t csrc)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = -0x14;
  if (this->init == true) {
    lVar3 = (long)this->numcsrcs;
    iVar1 = -0xe;
    if (lVar3 < 0xf) {
      if (0 < this->numcsrcs) {
        lVar2 = 0;
        do {
          if (this->csrcs[lVar2] == csrc) {
            return -0xd;
          }
          lVar2 = lVar2 + 1;
        } while (lVar3 != lVar2);
      }
      this->csrcs[lVar3] = csrc;
      this->numcsrcs = this->numcsrcs + 1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int RTPPacketBuilder::AddCSRC(uint32_t csrc)
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	if (numcsrcs >= RTP_MAXCSRCS)
		return ERR_RTP_PACKBUILD_CSRCLISTFULL;

	int i;
	
	for (i = 0 ; i < numcsrcs ; i++)
	{
		if (csrcs[i] == csrc)
			return ERR_RTP_PACKBUILD_CSRCALREADYINLIST;
	}
	csrcs[numcsrcs] = csrc;
	numcsrcs++;
	return 0;
}